

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImFont::ClearOutputData(ImFont *this)

{
  this->FontSize = 0.0;
  ImVector<ImFontGlyph>::clear(&this->Glyphs);
  ImVector<float>::clear(&this->IndexAdvanceX);
  ImVector<unsigned_short>::clear(&this->IndexLookup);
  this->FallbackGlyph = (ImFontGlyph *)0x0;
  this->FallbackAdvanceX = 0.0;
  *(undefined8 *)&this->ConfigDataCount = 0;
  *(undefined8 *)((long)&this->ConfigData + 6) = 0;
  this->ContainerAtlas = (ImFontAtlas *)0x0;
  this->Ascent = 0.0;
  this->Descent = 0.0;
  this->DirtyLookupTables = true;
  this->MetricsTotalSurface = 0;
  return;
}

Assistant:

void    ImFont::ClearOutputData()
{
    FontSize = 0.0f;
    Glyphs.clear();
    IndexAdvanceX.clear();
    IndexLookup.clear();
    FallbackGlyph = NULL;
    FallbackAdvanceX = 0.0f;
    ConfigDataCount = 0;
    ConfigData = NULL;
    ContainerAtlas = NULL;
    Ascent = Descent = 0.0f;
    DirtyLookupTables = true;
    MetricsTotalSurface = 0;
}